

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O2

FMFieldList validate_and_copy_field_list(FMFieldList field_list,FMFormat_conflict fmformat)

{
  uint uVar1;
  int iVar2;
  undefined4 uVar3;
  FMdata_type FVar4;
  FMFieldList __base;
  ulong uVar5;
  char *pcVar6;
  char *pcVar7;
  int iVar8;
  long lVar9;
  size_t __nmemb;
  int iVar10;
  ulong uVar11;
  bool bVar12;
  long elements;
  
  uVar1 = count_FMfield(field_list);
  __base = (FMFieldList)ffs_malloc((long)(int)(uVar1 + 1) * 0x18);
  uVar5 = 0;
  if (0 < (int)uVar1) {
    uVar5 = (ulong)uVar1;
  }
  lVar9 = 0x14;
  uVar11 = 0;
  do {
    if (uVar5 == uVar11) {
      __nmemb = (size_t)(int)uVar1;
      __base[__nmemb].field_size = 0;
      __base[__nmemb].field_offset = 0;
      __base[__nmemb].field_name = (char *)0x0;
      __base[__nmemb].field_type = (char *)0x0;
      fmformat->field_count = uVar1;
      fmformat->field_list = __base;
      qsort(__base,__nmemb,0x18,field_offset_compar);
      return __base;
    }
    pcVar7 = *(char **)((long)field_list + lVar9 + -0xc);
    pcVar6 = strchr(pcVar7,0x5b);
    if (pcVar6 == (char *)0x0) {
      pcVar6 = strchr(pcVar7,0x2a);
      if (pcVar6 != (char *)0x0) {
        iVar2 = fmformat->pointer_size;
        goto LAB_00119808;
      }
      FVar4 = FMstr_to_data_type(pcVar7);
      bVar12 = FVar4 == string_type;
      iVar2 = *(int *)((long)field_list + lVar9 + -4);
    }
    else {
      iVar2 = is_var_array_field(field_list,(int)uVar11);
      if (iVar2 == 0) {
        pcVar7 = *(char **)((long)field_list + lVar9 + -0xc);
        pcVar6 = strchr(pcVar7,0x2a);
        if (pcVar6 == (char *)0x0) {
          FVar4 = FMarray_str_to_data_type(pcVar7,&elements);
          if ((FVar4 != unknown_type) && (0x10 < *(int *)((long)field_list + lVar9 + -4))) {
            fprintf(_stderr,
                    "Field size for field %s in format %s is large, check to see if it is valid.\n",
                    *(undefined8 *)((long)field_list + lVar9 + -0x14),fmformat->format_name);
          }
          iVar2 = (int)elements * *(int *)((long)field_list + lVar9 + -4);
          if (iVar2 < 1) {
            fprintf(_stderr,
                    "Field Size is not positive!  field type \"%s\" base= %d, elements=%ld\n",
                    *(undefined8 *)((long)field_list + lVar9 + -0xc));
            return (FMFieldList)0x0;
          }
          bVar12 = FVar4 == string_type;
          goto LAB_0011980b;
        }
      }
      iVar2 = fmformat->pointer_size;
      if (iVar2 < 1) {
        fprintf(_stderr,"Pointer Size is not positive! BAD! pointer size = %d\n");
        return (FMFieldList)0x0;
      }
LAB_00119808:
      bVar12 = false;
    }
LAB_0011980b:
    iVar10 = *(int *)((long)&field_list->field_name + lVar9);
    iVar8 = iVar2 + iVar10;
    if (iVar2 + iVar10 < fmformat->record_length) {
      iVar8 = fmformat->record_length;
    }
    fmformat->record_length = iVar8;
    pcVar7 = strdup(*(char **)((long)field_list + lVar9 + -0x14));
    *(char **)((long)__base + lVar9 + -0x14) = pcVar7;
    if ((fmformat->context->ignore_default_values == 0) &&
       (pcVar7 = strchr(pcVar7,0x28), pcVar7 != (char *)0x0)) {
      *pcVar7 = '\0';
      iVar10 = *(int *)((long)&field_list->field_name + lVar9);
    }
    pcVar7 = strdup(*(char **)((long)field_list + lVar9 + -0xc));
    *(char **)((long)__base + lVar9 + -0xc) = pcVar7;
    uVar3 = 8;
    if (!bVar12) {
      uVar3 = *(undefined4 *)((long)field_list + lVar9 + -4);
    }
    *(undefined4 *)((long)__base + lVar9 + -4) = uVar3;
    *(int *)((long)&__base->field_name + lVar9) = iVar10;
    uVar11 = uVar11 + 1;
    lVar9 = lVar9 + 0x18;
  } while( true );
}

Assistant:

FMFieldList
validate_and_copy_field_list(FMFieldList field_list, FMFormat fmformat)
{
    int field;
    FMFieldList new_field_list;
    int field_count = count_FMfield(field_list);
    new_field_list = (FMFieldList) malloc((size_t) sizeof(FMField) *
					     (field_count + 1));
    for (field = 0; field < field_count; field++) {
	int field_size = 0;
	int simple_string = 0;
	if (strchr(field_list[field].field_type, '[') == NULL) {
	    /* not an array */
	    if (strchr(field_list[field].field_type, '*') == NULL) {
		if (FMstr_to_data_type(field_list[field].field_type) == string_type) {
		    simple_string = 1;
		}
		field_size = field_list[field].field_size;
	    } else {
		field_size = fmformat->pointer_size;
	    }
	} else {
	    int ret = is_var_array_field(field_list, field);
	    if (ret == -1) return NULL;   /* rejected */
	    if ((ret == 1) || (strchr(field_list[field].field_type, '*'))) {
		/* variant array, real_field_size is
		 * fmc->pointer_size */
		field_size = fmformat->pointer_size;
		if (field_size <= 0) {
		    fprintf(stderr, "Pointer Size is not positive! BAD! pointer size = %d\n",
			    fmformat->pointer_size);
		    return NULL;
		}
	    } else {
		long elements;
		FMdata_type base_type;
		
		base_type = FMarray_str_to_data_type(field_list[field].field_type,
						   &elements);
		if ((base_type != unknown_type) &&
		    (field_list[field].field_size > 16)) {
		    fprintf(stderr, "Field size for field %s in format %s is large, check to see if it is valid.\n",
			    field_list[field].field_name, fmformat->format_name);
		}
		field_size = field_list[field].field_size * elements;
		if (field_size <= 0) {
		    fprintf(stderr, "Field Size is not positive!  field type \"%s\" base= %d, elements=%ld\n",
			    field_list[field].field_type,
			    field_list[field].field_size, elements);
		    return NULL;
		}
		if (base_type == string_type) {
		    simple_string = 1;
		}
	    }
	}

	fmformat->record_length = Max(fmformat->record_length,
					 field_list[field].field_offset +
					    field_size);
	new_field_list[field].field_name = strdup(field_list[field].field_name);
	if  (fmformat->context->ignore_default_values) {
	    new_field_list[field].field_name = new_field_list[field].field_name;
	} else {
	    field_name_strip_default((char *)new_field_list[field].field_name);
	}
	new_field_list[field].field_type = strdup(field_list[field].field_type);
	new_field_list[field].field_size = field_list[field].field_size;
	if (simple_string) {
	    new_field_list[field].field_size = sizeof(char*);
	}
	new_field_list[field].field_offset = field_list[field].field_offset;
    }
    new_field_list[field_count].field_name = NULL;
    new_field_list[field_count].field_type = NULL;
    new_field_list[field_count].field_size = 0;
    new_field_list[field_count].field_offset = 0;
    fmformat->field_count = field_count;
    fmformat->field_list = new_field_list;
    qsort(fmformat->field_list, field_count, sizeof(FMField),
	  field_offset_compar);
    return new_field_list;
}